

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O0

void __thiscall
delaunator::Delaunator::Delaunator
          (Delaunator *this,vector<double,_std::allocator<double>_> *in_coords)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  value_type vVar5;
  value_type vVar6;
  size_type __n;
  double dVar7;
  __type __x;
  compare __comp;
  bool bVar8;
  size_type sVar9;
  double __n_00;
  const_reference pvVar10;
  runtime_error *this_00;
  iterator iVar11;
  iterator iVar12;
  size_t sVar13;
  reference pvVar14;
  size_t sVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  pair<double,_double> pVar17;
  long local_380;
  size_type local_1e8;
  size_t next;
  size_t t;
  size_t q;
  size_t e;
  size_t j;
  size_t key;
  size_t start;
  double y_1;
  double x_1;
  size_t i_4;
  size_t k;
  double yp;
  double xp;
  size_t max_triangles;
  size_t hull_size;
  tuple<double&,double&> local_138 [16];
  pair<double,_double> local_128;
  double local_118;
  double i2y;
  double i2x;
  double r;
  size_t i_3;
  double min_radius;
  double i1y;
  double i1x;
  double d_1;
  size_t i_2;
  double i0y;
  double i0x;
  double d;
  size_t i_1;
  size_t i2;
  size_t i1;
  size_t i0;
  double min_dist;
  double cy;
  double cx;
  double y;
  double x;
  size_t i;
  undefined1 local_58 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  double min_y;
  double min_x;
  double max_y;
  double max_x;
  size_t n;
  vector<double,_std::allocator<double>_> *in_coords_local;
  Delaunator *this_local;
  
  this->coords = in_coords;
  (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->triangles).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->triangles);
  (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->halfedges);
  (this->hull_prev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hull_prev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hull_prev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->hull_prev);
  (this->hull_next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hull_next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hull_next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->hull_next);
  (this->hull_tri).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hull_tri).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hull_tri).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->hull_tri);
  this->hull_start = 0;
  (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_hash);
  this->m_center_x = 0.0;
  this->m_center_y = 0.0;
  this->m_hash_size = 0;
  (this->m_edge_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_edge_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_edge_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_edge_stack);
  sVar9 = std::vector<double,_std::allocator<double>_>::size(this->coords);
  __n_00 = (double)(sVar9 >> 1);
  max_y = std::numeric_limits<double>::min();
  min_x = std::numeric_limits<double>::min();
  min_y = std::numeric_limits<double>::max();
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::numeric_limits<double>::max();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,(size_type)__n_00);
  for (x = 0.0; (ulong)x < (ulong)__n_00; x = (double)((long)x + 1)) {
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,(long)x << 1);
    y = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,(long)x * 2 + 1)
    ;
    cx = *pvVar10;
    if (y < min_y) {
      min_y = y;
    }
    if (cx < (double)ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) {
      ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)cx;
    }
    if (max_y < y) {
      max_y = y;
    }
    if (min_x < cx) {
      min_x = cx;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
               (value_type_conflict1 *)&x);
  }
  cy = (min_y + max_y) / 2.0;
  min_dist = ((double)ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + min_x) / 2.0;
  i0 = (size_t)std::numeric_limits<double>::max();
  i1 = 0xffffffffffffffff;
  i2 = 0xffffffffffffffff;
  i_1 = 0xffffffffffffffff;
  for (d = 0.0; dVar2 = cy, dVar7 = min_dist, (ulong)d < (ulong)__n_00; d = (double)((long)d + 1)) {
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,(long)d * 2);
    dVar1 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,(long)d * 2 + 1)
    ;
    i0x = dist(dVar2,dVar7,dVar1,*pvVar10);
    if (i0x < (double)i0) {
      i1 = (size_t)d;
      i0 = (size_t)i0x;
    }
  }
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i1 << 1);
  i0y = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i1 * 2 + 1);
  i_2 = (size_t)*pvVar10;
  i0 = (size_t)std::numeric_limits<double>::max();
  for (d_1 = 0.0; dVar7 = i0y, sVar13 = i_2, (ulong)d_1 < (ulong)__n_00;
      d_1 = (double)((long)d_1 + 1)) {
    if (d_1 != (double)i1) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,(long)d_1 * 2)
      ;
      dVar2 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (this->coords,(long)d_1 * 2 + 1);
      i1x = dist(dVar7,(double)sVar13,dVar2,*pvVar10);
      if ((i1x < (double)i0) && (0.0 < i1x)) {
        i2 = (size_t)d_1;
        i0 = (size_t)i1x;
      }
    }
  }
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i2 << 1);
  i1y = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i2 * 2 + 1);
  min_radius = *pvVar10;
  i_3 = (size_t)std::numeric_limits<double>::max();
  for (r = 0.0; dVar1 = i0y, sVar15 = i_2, dVar2 = i1y, dVar7 = min_radius, sVar13 = i_3,
      (ulong)r < (ulong)__n_00; r = (double)((long)r + 1)) {
    if ((r != (double)i1) && (r != (double)i2)) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,(long)r * 2);
      dVar3 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (this->coords,(long)r * 2 + 1);
      i2x = circumradius(dVar1,(double)sVar15,dVar2,dVar7,dVar3,*pvVar10);
      if (i2x < (double)i_3) {
        i_1 = (size_t)r;
        i_3 = (size_t)i2x;
      }
    }
  }
  dVar7 = std::numeric_limits<double>::max();
  if (dVar7 <= (double)sVar13) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"not triangulation");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i_1 * 2);
  i2y = *pvVar10;
  pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i_1 * 2 + 1);
  local_118 = *pvVar10;
  bVar8 = orient(i0y,(double)i_2,i1y,min_radius,i2y,local_118);
  if (bVar8) {
    std::swap<unsigned_long>(&i2,&i_1);
    std::swap<double>(&i1y,&i2y);
    std::swap<double>(&min_radius,&local_118);
  }
  pVar17 = circumcenter(i0y,(double)i_2,i1y,min_radius,i2y,local_118);
  local_128.second = pVar17.second;
  local_128.first = pVar17.first;
  std::tie<double,double>((double *)local_138,&this->m_center_x);
  std::tuple<double&,double&>::operator=(local_138,&local_128);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
  iVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
  __comp.cx = this->m_center_x;
  __comp.coords = this->coords;
  __comp.cy = this->m_center_y;
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,delaunator::compare>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar12._M_current,__comp);
  __x = std::sqrt<unsigned_long>((unsigned_long)__n_00);
  dVar7 = ceil(__x);
  sVar13 = llround(dVar7);
  this->m_hash_size = sVar13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_hash,this->m_hash_size);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_hash);
  iVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_hash);
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar12._M_current,&INVALID_INDEX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->hull_prev,(size_type)__n_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->hull_next,(size_type)__n_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->hull_tri,(size_type)__n_00);
  sVar15 = i2;
  this->hull_start = i1;
  pvVar16 = &this->hull_prev;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar16,i_1);
  *pvVar14 = sVar15;
  this_01 = &this->hull_next;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_01,i1);
  sVar13 = i_1;
  *pvVar14 = sVar15;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar16,i1);
  *pvVar14 = sVar13;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_01,i2);
  sVar15 = i1;
  *pvVar14 = sVar13;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar16,i2);
  *pvVar14 = sVar15;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_01,i_1);
  *pvVar14 = sVar15;
  pvVar16 = &this->hull_tri;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar16,i1);
  *pvVar14 = 0;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar16,i2);
  *pvVar14 = 1;
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar16,i_1);
  sVar13 = i1;
  *pvVar14 = 2;
  sVar15 = hash_key(this,i0y,(double)i_2);
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&this->m_hash,sVar15);
  sVar15 = i2;
  *pvVar14 = sVar13;
  sVar13 = hash_key(this,i1y,min_radius);
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&this->m_hash,sVar13);
  sVar13 = i_1;
  *pvVar14 = sVar15;
  sVar15 = hash_key(this,i2y,local_118);
  pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&this->m_hash,sVar15);
  *pvVar14 = sVar13;
  if ((ulong)__n_00 < 3) {
    local_380 = 1;
  }
  else {
    local_380 = (long)__n_00 * 2 + -5;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->triangles,local_380 * 3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->halfedges,local_380 * 3);
  add_triangle(this,i1,i2,i_1,0xffffffffffffffff,0xffffffffffffffff,0xffffffffffffffff);
  yp = std::numeric_limits<double>::quiet_NaN();
  k = (size_t)std::numeric_limits<double>::quiet_NaN();
  i_4 = 0;
  do {
    if ((ulong)__n_00 <= i_4) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
      return;
    }
    pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,i_4);
    sVar9 = *pvVar14;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,sVar9 << 1);
    dVar7 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,sVar9 * 2 + 1);
    dVar2 = *pvVar10;
    if ((((i_4 == 0) || (bVar8 = check_pts_equal(dVar7,dVar2,yp,(double)k), !bVar8)) &&
        (bVar8 = check_pts_equal(dVar7,dVar2,i0y,(double)i_2), k = (size_t)dVar2, yp = dVar7, !bVar8
        )) && ((bVar8 = check_pts_equal(dVar7,dVar2,i1y,min_radius), !bVar8 &&
               (bVar8 = check_pts_equal(dVar7,dVar2,i2y,local_118), !bVar8)))) {
      key = 0;
      sVar13 = hash_key(this,dVar7,dVar2);
      for (e = 0; e < this->m_hash_size; e = e + 1) {
        sVar15 = fast_mod(sVar13 + e,this->m_hash_size);
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->m_hash,sVar15);
        key = *pvVar14;
        if ((key != 0xffffffffffffffff) &&
           (pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->hull_next,key), key != *pvVar14)) break;
      }
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->hull_prev,key);
      vVar5 = *pvVar14;
      q = vVar5;
      do {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_next,q);
        vVar6 = *pvVar14;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,q * 2);
        dVar1 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,q * 2 + 1);
        dVar3 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,vVar6 * 2);
        dVar4 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (this->coords,vVar6 * 2 + 1);
        bVar8 = orient(dVar7,dVar2,dVar1,dVar3,dVar4,*pvVar10);
        if (((bVar8 ^ 0xffU) & 1) == 0) goto LAB_00121b08;
        q = vVar6;
      } while (vVar6 != vVar5);
      q = 0xffffffffffffffff;
LAB_00121b08:
      if (q != 0xffffffffffffffff) {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_next,q);
        sVar13 = *pvVar14;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_tri,q);
        sVar13 = add_triangle(this,q,sVar9,sVar13,0xffffffffffffffff,0xffffffffffffffff,*pvVar14);
        sVar15 = legalize(this,sVar13 + 2);
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_tri,sVar9);
        *pvVar14 = sVar15;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_tri,q);
        *pvVar14 = sVar13;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_next,q);
        local_1e8 = *pvVar14;
        while( true ) {
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->hull_next,local_1e8);
          sVar13 = *pvVar14;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (this->coords,local_1e8 * 2);
          dVar1 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (this->coords,local_1e8 * 2 + 1);
          dVar3 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (this->coords,sVar13 * 2);
          dVar4 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (this->coords,sVar13 * 2 + 1);
          bVar8 = orient(dVar7,dVar2,dVar1,dVar3,dVar4,*pvVar10);
          if (!bVar8) break;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->hull_tri,sVar9);
          sVar15 = *pvVar14;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->hull_tri,local_1e8);
          sVar15 = add_triangle(this,local_1e8,sVar9,sVar13,sVar15,0xffffffffffffffff,*pvVar14);
          sVar15 = legalize(this,sVar15 + 2);
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->hull_tri,sVar9);
          *pvVar14 = sVar15;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->hull_next,local_1e8);
          *pvVar14 = local_1e8;
          local_1e8 = sVar13;
        }
        if (q == vVar5) {
          while( true ) {
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->hull_prev,q);
            __n = *pvVar14;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,__n * 2)
            ;
            dVar1 = *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (this->coords,__n * 2 + 1);
            dVar3 = *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,q * 2);
            dVar4 = *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (this->coords,q * 2 + 1);
            bVar8 = orient(dVar7,dVar2,dVar1,dVar3,dVar4,*pvVar10);
            if (!bVar8) break;
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->hull_tri,q);
            sVar13 = *pvVar14;
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->hull_tri,__n);
            sVar13 = add_triangle(this,__n,sVar9,q,0xffffffffffffffff,sVar13,*pvVar14);
            legalize(this,sVar13 + 2);
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->hull_tri,__n);
            *pvVar14 = sVar13;
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->hull_next,q);
            *pvVar14 = q;
            q = __n;
          }
        }
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_prev,sVar9);
        *pvVar14 = q;
        this->hull_start = q;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_prev,local_1e8);
        *pvVar14 = sVar9;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_next,q);
        *pvVar14 = sVar9;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->hull_next,sVar9);
        *pvVar14 = local_1e8;
        sVar13 = hash_key(this,dVar7,dVar2);
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->m_hash,sVar13);
        *pvVar14 = sVar9;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,q * 2);
        dVar7 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,q * 2 + 1);
        sVar13 = hash_key(this,dVar7,*pvVar10);
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->m_hash,sVar13);
        *pvVar14 = q;
      }
    }
    i_4 = i_4 + 1;
  } while( true );
}

Assistant:

Delaunator::Delaunator(std::vector<double> const& in_coords)
    : coords(in_coords),
      triangles(),
      halfedges(),
      hull_prev(),
      hull_next(),
      hull_tri(),
      hull_start(),
      m_hash(),
      m_center_x(),
      m_center_y(),
      m_hash_size(),
      m_edge_stack() {
    std::size_t n = coords.size() >> 1;

    double max_x = std::numeric_limits<double>::min();
    double max_y = std::numeric_limits<double>::min();
    double min_x = std::numeric_limits<double>::max();
    double min_y = std::numeric_limits<double>::max();
    std::vector<std::size_t> ids;
    ids.reserve(n);

    for (std::size_t i = 0; i < n; i++) {
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        if (x < min_x) min_x = x;
        if (y < min_y) min_y = y;
        if (x > max_x) max_x = x;
        if (y > max_y) max_y = y;

        ids.push_back(i);
    }
    const double cx = (min_x + max_x) / 2;
    const double cy = (min_y + max_y) / 2;
    double min_dist = std::numeric_limits<double>::max();

    std::size_t i0 = INVALID_INDEX;
    std::size_t i1 = INVALID_INDEX;
    std::size_t i2 = INVALID_INDEX;

    // pick a seed point close to the centroid
    for (std::size_t i = 0; i < n; i++) {
        const double d = dist(cx, cy, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist) {
            i0 = i;
            min_dist = d;
        }
    }

    const double i0x = coords[2 * i0];
    const double i0y = coords[2 * i0 + 1];

    min_dist = std::numeric_limits<double>::max();

    // find the point closest to the seed
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0) continue;
        const double d = dist(i0x, i0y, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist && d > 0.0) {
            i1 = i;
            min_dist = d;
        }
    }

    double i1x = coords[2 * i1];
    double i1y = coords[2 * i1 + 1];

    double min_radius = std::numeric_limits<double>::max();

    // find the third point which forms the smallest circumcircle with the first two
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0 || i == i1) continue;

        const double r = circumradius(
            i0x, i0y, i1x, i1y, coords[2 * i], coords[2 * i + 1]);

        if (r < min_radius) {
            i2 = i;
            min_radius = r;
        }
    }

    if (!(min_radius < std::numeric_limits<double>::max())) {
        throw std::runtime_error("not triangulation");
    }

    double i2x = coords[2 * i2];
    double i2y = coords[2 * i2 + 1];

    if (orient(i0x, i0y, i1x, i1y, i2x, i2y)) {
        std::swap(i1, i2);
        std::swap(i1x, i2x);
        std::swap(i1y, i2y);
    }

    std::tie(m_center_x, m_center_y) = circumcenter(i0x, i0y, i1x, i1y, i2x, i2y);

    // sort the points by distance from the seed triangle circumcenter
    std::sort(ids.begin(), ids.end(), compare{ coords, m_center_x, m_center_y });

    // initialize a hash table for storing edges of the advancing convex hull
    m_hash_size = static_cast<std::size_t>(std::llround(std::ceil(std::sqrt(n))));
    m_hash.resize(m_hash_size);
    std::fill(m_hash.begin(), m_hash.end(), INVALID_INDEX);

    // initialize arrays for tracking the edges of the advancing convex hull
    hull_prev.resize(n);
    hull_next.resize(n);
    hull_tri.resize(n);

    hull_start = i0;

    size_t hull_size = 3;

    hull_next[i0] = hull_prev[i2] = i1;
    hull_next[i1] = hull_prev[i0] = i2;
    hull_next[i2] = hull_prev[i1] = i0;

    hull_tri[i0] = 0;
    hull_tri[i1] = 1;
    hull_tri[i2] = 2;

    m_hash[hash_key(i0x, i0y)] = i0;
    m_hash[hash_key(i1x, i1y)] = i1;
    m_hash[hash_key(i2x, i2y)] = i2;

    std::size_t max_triangles = n < 3 ? 1 : 2 * n - 5;
    triangles.reserve(max_triangles * 3);
    halfedges.reserve(max_triangles * 3);
    add_triangle(i0, i1, i2, INVALID_INDEX, INVALID_INDEX, INVALID_INDEX);
    double xp = std::numeric_limits<double>::quiet_NaN();
    double yp = std::numeric_limits<double>::quiet_NaN();
    for (std::size_t k = 0; k < n; k++) {
        const std::size_t i = ids[k];
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        // skip near-duplicate points
        if (k > 0 && check_pts_equal(x, y, xp, yp)) continue;
        xp = x;
        yp = y;

        // skip seed triangle points
        if (
            check_pts_equal(x, y, i0x, i0y) ||
            check_pts_equal(x, y, i1x, i1y) ||
            check_pts_equal(x, y, i2x, i2y)) continue;

        // find a visible edge on the convex hull using edge hash
        std::size_t start = 0;

        size_t key = hash_key(x, y);
        for (size_t j = 0; j < m_hash_size; j++) {
            start = m_hash[fast_mod(key + j, m_hash_size)];
            if (start != INVALID_INDEX && start != hull_next[start]) break;
        }

        start = hull_prev[start];
        size_t e = start;
        size_t q;

        while (q = hull_next[e], !orient(x, y, coords[2 * e], coords[2 * e + 1], coords[2 * q], coords[2 * q + 1])) { //TODO: does it works in a same way as in JS
            e = q;
            if (e == start) {
                e = INVALID_INDEX;
                break;
            }
        }

        if (e == INVALID_INDEX) continue; // likely a near-duplicate point; skip it

        // add the first triangle from the point
        std::size_t t = add_triangle(
            e,
            i,
            hull_next[e],
            INVALID_INDEX,
            INVALID_INDEX,
            hull_tri[e]);

        hull_tri[i] = legalize(t + 2);
        hull_tri[e] = t;
        hull_size++;

        // walk forward through the hull, adding more triangles and flipping recursively
        std::size_t next = hull_next[e];
        while (
            q = hull_next[next],
            orient(x, y, coords[2 * next], coords[2 * next + 1], coords[2 * q], coords[2 * q + 1])) {
            t = add_triangle(next, i, q, hull_tri[i], INVALID_INDEX, hull_tri[next]);
            hull_tri[i] = legalize(t + 2);
            hull_next[next] = next; // mark as removed
            hull_size--;
            next = q;
        }

        // walk backward from the other side, adding more triangles and flipping
        if (e == start) {
            while (
                q = hull_prev[e],
                orient(x, y, coords[2 * q], coords[2 * q + 1], coords[2 * e], coords[2 * e + 1])) {
                t = add_triangle(q, i, e, INVALID_INDEX, hull_tri[e], hull_tri[q]);
                legalize(t + 2);
                hull_tri[q] = t;
                hull_next[e] = e; // mark as removed
                hull_size--;
                e = q;
            }
        }

        // update the hull indices
        hull_prev[i] = e;
        hull_start = e;
        hull_prev[next] = i;
        hull_next[e] = i;
        hull_next[i] = next;

        m_hash[hash_key(x, y)] = i;
        m_hash[hash_key(coords[2 * e], coords[2 * e + 1])] = e;
    }
}